

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_11f14fc::IFFT2DTest::SetUp(IFFT2DTest *this)

{
  bool bVar1;
  ParamType *pPVar2;
  void *pvVar3;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int n;
  AssertHelper *in_stack_ffffffffffffff40;
  float **in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  Type in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertHelper *this_01;
  AssertionResult local_88 [2];
  undefined8 local_68;
  AssertionResult local_60;
  uint local_4c;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_20;
  int local_c;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::IFFTTestArg>::GetParam();
  local_c = pPVar2->n;
  pvVar3 = aom_memalign((size_t)in_RDI,(size_t)in_stack_ffffffffffffff50);
  *(void **)(in_RDI + 0x18) = pvVar3;
  pvVar3 = aom_memalign((size_t)in_RDI,(size_t)in_stack_ffffffffffffff50);
  *(void **)(in_RDI + 0x20) = pvVar3;
  pvVar3 = aom_memalign((size_t)in_RDI,(size_t)in_stack_ffffffffffffff50);
  *(void **)(in_RDI + 0x28) = pvVar3;
  testing::internal::CmpHelperNE<float*,decltype(nullptr)>
            (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             &in_stack_ffffffffffffff40->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff50 =
         testing::AssertionResult::failure_message((AssertionResult *)0xb3c93e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0xb3c99b);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3ca19);
  if (local_4c == 0) {
    local_68 = 0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               &in_stack_ffffffffffffff40->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff48 =
           (float **)testing::AssertionResult::failure_message((AssertionResult *)0xb3ca94);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff50);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0xb3cae2);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3cb57);
    if (local_4c == 0) {
      this_01 = (AssertHelper *)0x0;
      testing::internal::CmpHelperNE<float*,decltype(nullptr)>
                (in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 &in_stack_ffffffffffffff40->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xb3cbcf);
        testing::internal::AssertHelper::AssertHelper
                  (this_01,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff50);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xb3cc1d);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3cc95);
      if (local_4c == 0) {
        memset(*(void **)(in_RDI + 0x18),0,(long)local_c * 4 * (long)local_c * 2);
        memset(*(void **)(in_RDI + 0x20),0,(long)local_c * 4 * (long)local_c * 2);
        memset(*(void **)(in_RDI + 0x28),0,(long)local_c * 4 * (long)local_c);
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    int n = GetParam().n;
    input_ = (float *)aom_memalign(32, sizeof(*input_) * n * n * 2);
    temp_ = (float *)aom_memalign(32, sizeof(*temp_) * n * n * 2);
    output_ = (float *)aom_memalign(32, sizeof(*output_) * n * n);
    ASSERT_NE(input_, nullptr);
    ASSERT_NE(temp_, nullptr);
    ASSERT_NE(output_, nullptr);
    memset(input_, 0, sizeof(*input_) * n * n * 2);
    memset(temp_, 0, sizeof(*temp_) * n * n * 2);
    memset(output_, 0, sizeof(*output_) * n * n);
  }